

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

Str * __thiscall Error::Private::Str::operator=(Str *this,Str *other)

{
  usize uVar1;
  char *__dest;
  ulong __n;
  
  if (this->_ptr != (char *)0x0) {
    operator_delete__(this->_ptr);
  }
  uVar1 = other->_len;
  this->_len = uVar1;
  __n = uVar1 + 1;
  __dest = (char *)operator_new__(__n);
  this->_ptr = __dest;
  memcpy(__dest,other->_ptr,__n);
  return this;
}

Assistant:

Str& operator=(const Str& other)
    {
      delete []_ptr;
      _len = other._len;
      _ptr = new char[_len + 1];
      memcpy(_ptr, other._ptr, _len + 1);
      return *this;

    }